

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonGrow(JsonString *p,u32 N)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  u64 nBytes;
  
  uVar1 = p->nAlloc;
  nBytes = (ulong)N + 10 + uVar1;
  if (N < uVar1) {
    nBytes = uVar1 * 2;
  }
  if (p->bStatic == '\0') {
    pcVar3 = p->zBuf;
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      pcVar3 = (char *)sqlite3Realloc(pcVar3,nBytes);
    }
    else {
      pcVar3 = (char *)0x0;
    }
    if (pcVar3 == (char *)0x0) goto LAB_001e4c2b;
    p->zBuf = pcVar3;
  }
  else {
    if (p->bErr != '\0') {
      return 1;
    }
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      pcVar3 = (char *)sqlite3Malloc(nBytes);
    }
    else {
      pcVar3 = (char *)0x0;
    }
    if (pcVar3 == (char *)0x0) {
LAB_001e4c2b:
      jsonOom(p);
      return 7;
    }
    memcpy(pcVar3,p->zBuf,p->nUsed);
    p->zBuf = pcVar3;
    p->bStatic = '\0';
  }
  p->nAlloc = nBytes;
  return 0;
}

Assistant:

static int jsonGrow(JsonString *p, u32 N){
  u64 nTotal = N<p->nAlloc ? p->nAlloc*2 : p->nAlloc+N+10;
  char *zNew;
  if( p->bStatic ){
    if( p->bErr ) return 1;
    zNew = sqlite3_malloc64(nTotal);
    if( zNew==0 ){
      jsonOom(p);
      return SQLITE_NOMEM;
    }
    memcpy(zNew, p->zBuf, (size_t)p->nUsed);
    p->zBuf = zNew;
    p->bStatic = 0;
  }else{
    zNew = sqlite3_realloc64(p->zBuf, nTotal);
    if( zNew==0 ){
      jsonOom(p);
      return SQLITE_NOMEM;
    }
    p->zBuf = zNew;
  }
  p->nAlloc = nTotal;
  return SQLITE_OK;
}